

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::TrimCapabilitiesPass::AddExtensionsForOperand
          (TrimCapabilitiesPass *this,spv_operand_type_t type,uint32_t value,
          ExtensionSet *extensions)

{
  uint uVar1;
  spv_operand_desc psVar2;
  spv_result_t sVar3;
  uint32_t uVar4;
  ulong uVar5;
  long lVar6;
  Extension *value_00;
  spv_operand_desc_t *desc;
  spv_operand_desc local_50;
  pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> local_48;
  
  local_50 = (spv_operand_desc)0x0;
  sVar3 = AssemblyGrammar::lookupOperand
                    (&((this->super_Pass).context_)->grammar_,type,value,&local_50);
  psVar2 = local_50;
  if (sVar3 == SPV_SUCCESS) {
    uVar1 = local_50->minVersion;
    uVar4 = spvVersionForTargetEnv(((this->super_Pass).context_)->syntax_context_->target_env);
    if ((uVar4 < uVar1) && (uVar5 = (ulong)psVar2->numExtensions, uVar5 != 0)) {
      value_00 = psVar2->extensions;
      lVar6 = uVar5 << 2;
      do {
        EnumSet<spvtools::Extension>::insert(&local_48,extensions,value_00);
        value_00 = value_00 + 1;
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::AddExtensionsForOperand(
    const spv_operand_type_t type, const uint32_t value,
    ExtensionSet* extensions) const {
  const spv_operand_desc_t* desc = nullptr;
  spv_result_t result = context()->grammar().lookupOperand(type, value, &desc);
  if (result != SPV_SUCCESS) {
    return;
  }
  addSupportedExtensionsToSet(desc, extensions);
}